

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O2

void helper_gvec_ssadd64_x86_64(void *d,void *a,void *b,uint32_t desc)

{
  ulong uVar1;
  ulong oprsz;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar2 = 0; uVar2 < oprsz; uVar2 = uVar2 + 8) {
    uVar1 = *(ulong *)((long)a + uVar2);
    uVar3 = *(ulong *)((long)b + uVar2) + uVar1;
    uVar4 = 0x7fffffffffffffff;
    if (-1 < (long)uVar3) {
      uVar4 = 0x8000000000000000;
    }
    if (-1 < (long)((uVar3 ^ uVar1) & ~(*(ulong *)((long)b + uVar2) ^ uVar1))) {
      uVar4 = uVar3;
    }
    *(ulong *)((long)d + uVar2) = uVar4;
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

void HELPER(gvec_ssadd64)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int64_t)) {
        int64_t ai = *(int64_t *)((char *)a + i);
        int64_t bi = *(int64_t *)((char *)b + i);
        int64_t di = ai + bi;
        if (((di ^ ai) &~ (ai ^ bi)) < 0) {
            /* Signed overflow.  */
            di = (di < 0 ? INT64_MAX : INT64_MIN);
        }
        *(int64_t *)((char *)d + i) = di;
    }
    clear_high(d, oprsz, desc);
}